

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::captureBlockTokens(HlslGrammar *this,TVector<glslang::HlslToken> *tokens)

{
  HlslToken *__args;
  pointer *ppHVar1;
  iterator __position;
  TString *pTVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  EHlslTokenClass EVar8;
  int iVar9;
  
  bVar7 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftBrace);
  iVar9 = 0;
  if (bVar7) {
    __args = &(this->super_HlslTokenStream).token;
    do {
      EVar8 = HlslTokenStream::peek(&this->super_HlslTokenStream);
      if (EVar8 == EHTokLeftBrace) {
        iVar9 = iVar9 + 1;
      }
      else if (EVar8 == EHTokRightBrace) {
        iVar9 = iVar9 + -1;
      }
      else if (EVar8 == EHTokNone) {
        iVar9 = 0;
        goto LAB_003a7dfc;
      }
      __position._M_current =
           (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
           super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (tokens->super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
          super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<glslang::HlslToken,glslang::pool_allocator<glslang::HlslToken>>::
        _M_realloc_insert<glslang::HlslToken_const&>
                  ((vector<glslang::HlslToken,glslang::pool_allocator<glslang::HlslToken>> *)tokens,
                   __position,__args);
      }
      else {
        (__position._M_current)->field_2 = (this->super_HlslTokenStream).token.field_2;
        pTVar2 = (__args->loc).name;
        iVar5 = (this->super_HlslTokenStream).token.loc.string;
        iVar6 = (this->super_HlslTokenStream).token.loc.line;
        uVar3 = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
        EVar8 = (this->super_HlslTokenStream).token.tokenClass;
        uVar4 = *(undefined4 *)&(this->super_HlslTokenStream).token.field_0x1c;
        ((__position._M_current)->loc).column = (this->super_HlslTokenStream).token.loc.column;
        *(undefined4 *)&((__position._M_current)->loc).field_0x14 = uVar3;
        (__position._M_current)->tokenClass = EVar8;
        *(undefined4 *)&(__position._M_current)->field_0x1c = uVar4;
        ((__position._M_current)->loc).name = pTVar2;
        ((__position._M_current)->loc).string = iVar5;
        ((__position._M_current)->loc).line = iVar6;
        ppHVar1 = &(tokens->
                   super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
                   super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppHVar1 = *ppHVar1 + 1;
      }
      HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    } while (0 < iVar9);
    iVar9 = 1;
  }
LAB_003a7dfc:
  return SUB41(iVar9,0);
}

Assistant:

bool HlslGrammar::captureBlockTokens(TVector<HlslToken>& tokens)
{
    if (! peekTokenClass(EHTokLeftBrace))
        return false;

    int braceCount = 0;

    do {
        switch (peek()) {
        case EHTokLeftBrace:
            ++braceCount;
            break;
        case EHTokRightBrace:
            --braceCount;
            break;
        case EHTokNone:
            // End of input before balance { } is bad...
            return false;
        default:
            break;
        }

        tokens.push_back(token);
        advanceToken();
    } while (braceCount > 0);

    return true;
}